

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O0

ssize_t kvtree_write_attempt(char *file,int fd,void *buf,size_t size)

{
  uint uVar1;
  ssize_t sVar2;
  int *piVar3;
  uint *puVar4;
  char *pcVar5;
  ssize_t rc;
  ulong uStack_38;
  int retries;
  ssize_t n;
  size_t size_local;
  void *buf_local;
  int fd_local;
  char *file_local;
  
  uStack_38 = 0;
  rc._4_4_ = 10;
  while( true ) {
    while( true ) {
      if (size <= uStack_38) {
        return uStack_38;
      }
      sVar2 = write(fd,(void *)((long)buf + uStack_38),size - uStack_38);
      if (sVar2 < 1) break;
      uStack_38 = uStack_38 + sVar2;
    }
    if (sVar2 == 0) break;
    piVar3 = __errno_location();
    if ((*piVar3 != 4) && (piVar3 = __errno_location(), *piVar3 != 0xb)) {
      rc._4_4_ = rc._4_4_ + -1;
      if (rc._4_4_ == 0) {
        puVar4 = (uint *)__errno_location();
        uVar1 = *puVar4;
        piVar3 = __errno_location();
        pcVar5 = strerror(*piVar3);
        kvtree_err("Giving up write of file %s errno=%d %s @ %s:%d",file,(ulong)uVar1,pcVar5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
                   ,0x148);
        return -1;
      }
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      piVar3 = __errno_location();
      pcVar5 = strerror(*piVar3);
      kvtree_err("Error writing file %s errno=%d %s @ %s:%d",file,(ulong)uVar1,pcVar5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
                 ,0x143);
    }
  }
  kvtree_err("Error writing file %s write returned 0 @ %s:%d",file,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
             ,0x135);
  return -1;
}

Assistant:

ssize_t kvtree_write_attempt(const char* file, int fd, const void* buf, size_t size)
{
  ssize_t n = 0;
  int retries = 10;
  while (n < size)
  {
    ssize_t rc = write(fd, (char*) buf + n, size - n);
    if (rc > 0) {
      n += rc;
    } else if (rc == 0) {
      /* something bad happened, print an error and abort */
      kvtree_err("Error writing file %s write returned 0 @ %s:%d",
        file, __FILE__, __LINE__
      );
      return -1;
    } else { /* (rc < 0) */
      /* got an error, check whether it was serious */
      if (errno == EINTR || errno == EAGAIN) {
        continue;
      }

      /* something worth printing an error about */
      retries--;
      if (retries) {
        /* print an error and try again */
        kvtree_err("Error writing file %s errno=%d %s @ %s:%d",
          file, errno, strerror(errno), __FILE__, __LINE__
        );
      } else {
        /* too many failed retries, give up */
        kvtree_err("Giving up write of file %s errno=%d %s @ %s:%d",
          file, errno, strerror(errno), __FILE__, __LINE__
        );
        return -1;
      }
    }
  }
  return n;
}